

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreLowerPeeps.cpp
# Opt level: O3

Instr * __thiscall Lowerer::PeepShl(Lowerer *this,Instr *instrShl)

{
  Opnd *this_00;
  long lVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  IntConstOpnd *pIVar6;
  Instr *pIVar7;
  RegOpnd *pRVar8;
  Opnd *pOVar9;
  Instr *this_01;
  Instr *this_02;
  Instr *local_38;
  
  pOVar9 = instrShl->m_src1;
  this_00 = instrShl->m_src2;
  OVar3 = IR::Opnd::GetKind(pOVar9);
  if ((OVar3 == OpndKindReg) && (OVar3 = IR::Opnd::GetKind(this_00), OVar3 == OpndKindIntConst)) {
    OVar3 = IR::Opnd::GetKind(pOVar9);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_0061e8c1;
      *puVar5 = 0;
    }
    if (((((ulong)pOVar9[1]._vptr_Opnd[3] & 1) != 0) &&
        (pOVar9[1]._vptr_Opnd[5] != (_func_int *)0x0)) && ((instrShl->field_0x38 & 0x10) == 0)) {
      OVar3 = IR::Opnd::GetKind(pOVar9);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) {
LAB_0061e8c1:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      this_02 = (Instr *)pOVar9[1]._vptr_Opnd[5];
      this_01 = (Instr *)0x0;
      if (((ulong)pOVar9[1]._vptr_Opnd[3] & 1) != 0) {
        this_01 = this_02;
      }
      if ((this_01->m_opcode == Shr_I4) &&
         (OVar3 = IR::Opnd::GetKind(this_01->m_src2), OVar3 == OpndKindIntConst)) {
        pIVar6 = IR::Opnd::AsIntConstOpnd(this_01->m_src2);
        lVar1 = (pIVar6->super_EncodableOpnd<long>).m_value;
        pIVar6 = IR::Opnd::AsIntConstOpnd(this_00);
        if (((lVar1 == (pIVar6->super_EncodableOpnd<long>).m_value) &&
            ((OVar3 = IR::Opnd::GetKind(this_01->m_src1), OVar3 == OpndKindReg &&
             ((pOVar9->field_0xb & 4) != 0)))) && ((this_01->field_0x38 & 0x10) == 0)) {
          if (instrShl->m_prev == (Instr *)0x0) {
            local_38 = (Instr *)0x0;
          }
          else {
            local_38 = instrShl->m_prev->m_next;
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          pIVar7 = (Instr *)0x0;
          while (this_02 = this_02->m_next, this_02 != local_38) {
            if ((pIVar7 != (Instr *)0x0) && (pIVar7->m_next != this_02)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                                 ,0xf3,
                                 "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instrIter)"
                                 ,"Modifying instr list but not using EDITING iterator!");
              if (!bVar4) goto LAB_0061e8c1;
              *puVar5 = 0;
            }
            if ((this_02->field_0x38 & 0x10) != 0) {
              return instrShl;
            }
            pRVar8 = IR::Opnd::AsRegOpnd(this_01->m_src1);
            pRVar8 = IR::Instr::FindRegDef(this_02,pRVar8->m_sym);
            if (pRVar8 != (RegOpnd *)0x0) {
              return instrShl;
            }
            pRVar8 = IR::Opnd::AsRegOpnd(pOVar9);
            bVar4 = IR::Instr::HasSymUse(this_02,pRVar8->m_sym);
            if (bVar4) {
              return instrShl;
            }
            pIVar7 = this_02;
            if (this_02->m_kind == InstrKindBranch) {
              return instrShl;
            }
          }
          IR::Instr::FreeSrc1(instrShl);
          pOVar9 = IR::Instr::UnlinkSrc1(this_01);
          IR::Instr::SetSrc1(instrShl,pOVar9);
          IR::Instr::Remove(this_01);
          pIVar6 = IR::Opnd::AsIntConstOpnd(this_00);
          lVar1 = (pIVar6->super_EncodableOpnd<long>).m_value;
          pIVar6 = IR::Opnd::AsIntConstOpnd(this_00);
          IR::IntConstOpnd::SetValue(pIVar6,(long)(-1 << ((byte)lVar1 & 0x1f)));
          instrShl->m_opcode = And_I4;
        }
      }
    }
  }
  return instrShl;
}

Assistant:

IR::Instr *Lowerer::PeepShl(IR::Instr *instrShl)
{
    IR::Opnd *src1;
    IR::Opnd *src2;
    IR::Instr *instrDef;

    src1 = instrShl->GetSrc1();
    src2 = instrShl->GetSrc2();

    // Peep:
    //    t1 = SHR X, cst
    //    t2 = SHL t1, cst
    //
    // Into:
    //    t2 = AND X, mask

    if (!src1->IsRegOpnd() || !src2->IsIntConstOpnd())
    {
        return instrShl;
    }
    if (!src1->AsRegOpnd()->m_sym->IsSingleDef())
    {
        return instrShl;
    }
    if (instrShl->HasBailOutInfo())
    {
        return instrShl;
    }
    instrDef = src1->AsRegOpnd()->m_sym->GetInstrDef();
    if (instrDef->m_opcode != Js::OpCode::Shr_I4 || !instrDef->GetSrc2()->IsIntConstOpnd()
        || instrDef->GetSrc2()->AsIntConstOpnd()->GetValue() != src2->AsIntConstOpnd()->GetValue()
        || !instrDef->GetSrc1()->IsRegOpnd())
    {
        return instrShl;
    }
    if (!src1->GetIsDead())
    {
        return instrShl;
    }
    if (instrDef->HasBailOutInfo())
    {
        return instrShl;
    }

    FOREACH_INSTR_IN_RANGE(instrIter, instrDef->m_next, instrShl->m_prev)
    {
        if (instrIter->HasBailOutInfo())
        {
            return instrShl;
        }
        if (instrIter->FindRegDef(instrDef->GetSrc1()->AsRegOpnd()->m_sym))
        {
            return instrShl;
        }
        if (instrIter->HasSymUse(src1->AsRegOpnd()->m_sym))
        {
            return instrShl;
        }
        // if any branch between def-use, don't do peeps on it because branch target might depend on the def
        if (instrIter->IsBranchInstr())
        {
            return instrShl;
        }
    } NEXT_INSTR_IN_RANGE;

    instrShl->FreeSrc1();
    instrShl->SetSrc1(instrDef->UnlinkSrc1());
    instrDef->Remove();

    IntConstType oldValue = src2->AsIntConstOpnd()->GetValue();

    // Left shift operator (<<) on arm32 is implemented by LSL which doesn't discard bits beyond lowerest 5-bit.
    // Need to discard such bits to conform to << in JavaScript. This is not a problem for x86 and x64 because
    // behavior of SHL is consistent with JavaScript but keep the below line for clarity.
    oldValue %= sizeof(int32) * 8;

    oldValue = ~((1 << oldValue) - 1);
    src2->AsIntConstOpnd()->SetValue(oldValue);

    instrShl->m_opcode = Js::OpCode::And_I4;

    return instrShl;
}